

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsIsInitialized(MessageGenerator *this)

{
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  value_type desc;
  value_type field_00;
  FieldGenerator *pFVar4;
  Iterator IVar5;
  Iterator IVar6;
  FieldDescriptor *field_1;
  Iterator __end4;
  Iterator __begin4;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4;
  OneofDescriptor *oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  MessageGenerator *this_local;
  
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = Descriptor::extension_range_count(this->descriptor_);
    if (iVar2 == 0) {
      if (this->num_required_fields_ == 0) {
        __end3 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin(&this->optimized_order_);
        field = (FieldDescriptor *)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end(&this->optimized_order_);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                           *)&field), bVar1) {
          ppFVar3 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end3);
          pFVar4 = FieldGeneratorTable::get(&this->field_generators_,*ppFVar3);
          bVar1 = FieldGenerator::NeedsIsInitialized(pFVar4);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end3);
        }
        if (this->num_weak_fields_ == 0) {
          __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
          IVar5 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
          __begin3_1._0_8_ = IVar5.descriptor;
          __end3_1.descriptor._0_4_ = IVar5.idx;
          IVar5 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
          __end3_1._0_8_ = IVar5.descriptor;
          oneof._0_4_ = IVar5.idx;
          while (bVar1 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar1
                ) {
            desc = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
            __begin4.descriptor =
                 (OneofDescriptor *)
                 protobuf::internal::FieldRange<google::protobuf::OneofDescriptor>(desc);
            IVar6 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                              ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                               &__begin4.descriptor);
            __begin4._0_8_ = IVar6.descriptor;
            __end4.descriptor._0_4_ = IVar6.idx;
            IVar6 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                              ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                               &__begin4.descriptor);
            __end4._0_8_ = IVar6.descriptor;
            field_1._0_4_ = IVar6.idx;
            while (bVar1 = protobuf::internal::operator!=
                                     ((Iterator *)&__end4.descriptor,(Iterator *)&field_1), bVar1) {
              field_00 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::
                         Iterator::operator*((Iterator *)&__end4.descriptor);
              pFVar4 = FieldGeneratorTable::get(&this->field_generators_,field_00);
              bVar1 = FieldGenerator::NeedsIsInitialized(pFVar4);
              if (bVar1) {
                return true;
              }
              protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
              operator++((Iterator *)&__end4.descriptor);
            }
            OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MessageGenerator::NeedsIsInitialized() {
  if (HasSimpleBaseClass(descriptor_, options_)) return false;
  if (descriptor_->extension_range_count() != 0) return true;
  if (num_required_fields_ != 0) return true;

  for (const auto* field : optimized_order_) {
    if (field_generators_.get(field).NeedsIsInitialized()) return true;
  }
  if (num_weak_fields_ != 0) return true;

  for (const auto* oneof : OneOfRange(descriptor_)) {
    for (const auto* field : FieldRange(oneof)) {
      if (field_generators_.get(field).NeedsIsInitialized()) return true;
    }
  }

  return false;
}